

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

string * __thiscall
tinyusdz::value::print_array_snipped<std::array<int,3ul>>
          (string *__return_storage_ptr__,value *this,array<int,_3UL> *vals,size_t n,size_t N)

{
  array<int,_3UL> *paVar1;
  size_t i;
  array<int,_3UL> *paVar2;
  value *pvVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (n == 0 || vals <= (array<int,_3UL> *)(n * 2)) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    if (vals != (array<int,_3UL> *)0x0) {
      paVar1 = (array<int,_3UL> *)0x0;
      do {
        if (paVar1 != (array<int,_3UL> *)0x0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,(int3 *)this);
        paVar1 = (array<int,_3UL> *)((long)paVar1->_M_elems + 1);
        this = this + 0xc;
      } while (vals != paVar1);
    }
  }
  else {
    paVar1 = (array<int,_3UL> *)((long)vals - n);
    if (vals < n) {
      n = (size_t)vals;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    paVar2 = (array<int,_3UL> *)0x0;
    pvVar3 = this;
    do {
      if (paVar2 != (array<int,_3UL> *)0x0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      ::std::operator<<(local_1a8,(int3 *)pvVar3);
      paVar2 = (array<int,_3UL> *)((long)paVar2->_M_elems + 1);
      pvVar3 = pvVar3 + 0xc;
    } while ((array<int,_3UL> *)n != paVar2);
    if (n < paVar1) {
      n = (size_t)paVar1;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
    if (n < vals) {
      pvVar3 = this + n * 0xc;
      paVar1 = (array<int,_3UL> *)n;
      do {
        if (n < paVar1) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,(int3 *)pvVar3);
        paVar1 = (array<int,_3UL> *)((long)paVar1->_M_elems + 1);
        pvVar3 = pvVar3 + 0xc;
      } while (vals != paVar1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}